

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

int libssh2_publickey_add_ex
              (LIBSSH2_PUBLICKEY *pkey,uchar *name,unsigned_long name_len,uchar *blob,
              unsigned_long blob_len,char overwrite,unsigned_long num_attrs,
              libssh2_publickey_attribute *attrs)

{
  char cVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_long *puVar6;
  uchar *puVar7;
  ssize_t sVar8;
  size_t sVar9;
  unsigned_long uVar10;
  char *pcVar11;
  size_t __n;
  char *local_70;
  
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    iVar4 = -0x27;
  }
  else {
    channel = pkey->channel;
    session = channel->session;
    if (pkey->add_state == libssh2_NB_state_idle) {
      pkey->add_packet = (uchar *)0x0;
      if (pkey->version == 1) {
        if (num_attrs == 0) {
          local_70 = (char *)0x0;
          __n = 0;
        }
        else {
          puVar6 = &attrs->value_len;
          local_70 = (char *)0x0;
          uVar10 = num_attrs;
          do {
            if ((puVar6[-2] == 7) &&
               (iVar4 = strncmp(((libssh2_publickey_attribute *)(puVar6 + -3))->name,"comment",7),
               iVar4 == 0)) {
              local_70 = (char *)puVar6[-1];
              __n = *puVar6;
              goto LAB_00120ca5;
            }
            puVar6 = puVar6 + 5;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          __n = 0;
        }
LAB_00120ca5:
        sVar9 = name_len + blob_len + __n + 0x17;
      }
      else {
        sVar9 = name_len + blob_len + 0x18;
        if (num_attrs != 0) {
          puVar6 = &attrs->value_len;
          uVar10 = num_attrs;
          do {
            sVar9 = sVar9 + puVar6[-2] + *puVar6 + 9;
            puVar6 = puVar6 + 5;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        local_70 = (char *)0x0;
        __n = 0;
      }
      puVar7 = (uchar *)(*session->alloc)(sVar9,&session->abstract);
      pkey->add_packet = puVar7;
      if (puVar7 == (uchar *)0x0) {
        iVar4 = _libssh2_error(session,-6,"Unable to allocate memory for publickey \"add\" packet");
        return iVar4;
      }
      pkey->add_s = puVar7;
      _libssh2_htonu32(puVar7,(int)sVar9 - 4);
      puVar7 = pkey->add_s;
      pkey->add_s = puVar7 + 4;
      _libssh2_htonu32(puVar7 + 4,3);
      puVar7 = pkey->add_s;
      pkey->add_s = puVar7 + 4;
      puVar7[6] = 'd';
      puVar7[4] = 'a';
      puVar7[5] = 'd';
      puVar7 = pkey->add_s + 3;
      pkey->add_s = puVar7;
      if (pkey->version == 1) {
        _libssh2_htonu32(puVar7,(uint32_t)__n);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + 4;
        if (local_70 != (char *)0x0) {
          memcpy(puVar7 + 4,local_70,__n);
          pkey->add_s = pkey->add_s + __n;
        }
        _libssh2_htonu32(pkey->add_s,(uint32_t)name_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + 4;
        memcpy(puVar7 + 4,name,name_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + name_len;
        _libssh2_htonu32(puVar7 + name_len,(uint32_t)blob_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + 4;
        memcpy(puVar7 + 4,blob,blob_len);
        pkey->add_s = pkey->add_s + blob_len;
      }
      else {
        _libssh2_htonu32(puVar7,(uint32_t)name_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + 4;
        memcpy(puVar7 + 4,name,name_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + name_len;
        _libssh2_htonu32(puVar7 + name_len,(uint32_t)blob_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + 4;
        memcpy(puVar7 + 4,blob,blob_len);
        puVar7 = pkey->add_s;
        pkey->add_s = puVar7 + blob_len + 1;
        (puVar7 + blob_len + 1)[-1] = overwrite != '\0';
        _libssh2_htonu32(pkey->add_s,(uint32_t)num_attrs);
        pkey->add_s = pkey->add_s + 4;
        if (num_attrs != 0) {
          pcVar11 = &attrs->mandatory;
          do {
            _libssh2_htonu32(pkey->add_s,(uint32_t)*(unsigned_long *)(pcVar11 + -0x18));
            puVar7 = pkey->add_s;
            pkey->add_s = puVar7 + 4;
            memcpy(puVar7 + 4,((libssh2_publickey_attribute *)(pcVar11 + -0x20))->name,
                   *(size_t *)(pcVar11 + -0x18));
            puVar7 = pkey->add_s;
            uVar10 = *(unsigned_long *)(pcVar11 + -0x18);
            pkey->add_s = puVar7 + uVar10;
            _libssh2_htonu32(puVar7 + uVar10,(uint32_t)*(unsigned_long *)(pcVar11 + -8));
            puVar7 = pkey->add_s;
            pkey->add_s = puVar7 + 4;
            memcpy(puVar7 + 4,*(char **)(pcVar11 + -0x10),*(size_t *)(pcVar11 + -8));
            uVar10 = *(unsigned_long *)(pcVar11 + -8);
            puVar7 = pkey->add_s;
            pkey->add_s = puVar7 + uVar10;
            cVar1 = *pcVar11;
            puVar7 = puVar7 + uVar10 + 1;
            pkey->add_s = puVar7;
            puVar7[-1] = cVar1 != '\0';
            pcVar11 = pcVar11 + 0x28;
            num_attrs = num_attrs - 1;
          } while (num_attrs != 0);
        }
      }
      pkey->add_state = libssh2_NB_state_created;
    }
    if (pkey->add_state == libssh2_NB_state_created) {
      bVar3 = false;
      sVar8 = _libssh2_channel_write
                        (channel,0,pkey->add_packet,(long)pkey->add_s - (long)pkey->add_packet);
      if (sVar8 == -0x25) {
        iVar4 = -0x25;
      }
      else {
        puVar7 = pkey->add_packet;
        puVar2 = pkey->add_s;
        iVar4 = (*session->free)(puVar7,&session->abstract);
        pkey->add_packet = (uchar *)0x0;
        if ((long)puVar2 - (long)puVar7 == sVar8) {
          pkey->add_state = libssh2_NB_state_sent;
          bVar3 = true;
        }
        else {
          iVar4 = _libssh2_error(session,-7,"Unable to send publickey add packet");
          bVar3 = false;
        }
      }
      if (!bVar3) {
        return iVar4;
      }
    }
    iVar5 = publickey_response_success(pkey);
    iVar4 = -0x25;
    if (iVar5 != -0x25) {
      pkey->add_state = libssh2_NB_state_idle;
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_add_ex(LIBSSH2_PUBLICKEY *pkey, const unsigned char *name,
                         unsigned long name_len, const unsigned char *blob,
                         unsigned long blob_len, char overwrite,
                         unsigned long num_attrs,
                         const libssh2_publickey_attribute attrs[])
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    /*  19 = packet_len(4) + add_len(4) + "add"(3) + name_len(4) + {name}
        blob_len(4) + {blob} */
    unsigned long i, packet_len = 19 + name_len + blob_len;
    unsigned char *comment = NULL;
    unsigned long comment_len = 0;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->add_state == libssh2_NB_state_idle) {
        pkey->add_packet = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Adding %s publickey", name));

        if(pkey->version == 1) {
            for(i = 0; i < num_attrs; i++) {
                /* Search for a comment attribute */
                if(attrs[i].name_len == (sizeof("comment") - 1) &&
                    strncmp(attrs[i].name, "comment",
                            sizeof("comment") - 1) == 0) {
                    comment = (unsigned char *) attrs[i].value;
                    comment_len = attrs[i].value_len;
                    break;
                }
            }
            packet_len += 4 + comment_len;
        }
        else {
            packet_len += 5;    /* overwrite(1) + attribute_count(4) */
            for(i = 0; i < num_attrs; i++) {
                packet_len += 9 + attrs[i].name_len + attrs[i].value_len;
                /* name_len(4) + value_len(4) + mandatory(1) */
            }
        }

        pkey->add_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!pkey->add_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "publickey \"add\" packet");
        }

        pkey->add_s = pkey->add_packet;
        _libssh2_htonu32(pkey->add_s, (uint32_t)(packet_len - 4));
        pkey->add_s += 4;
        _libssh2_htonu32(pkey->add_s, sizeof("add") - 1);
        pkey->add_s += 4;
        memcpy(pkey->add_s, "add", sizeof("add") - 1);
        pkey->add_s += sizeof("add") - 1;
        if(pkey->version == 1) {
            _libssh2_htonu32(pkey->add_s, (uint32_t)comment_len);
            pkey->add_s += 4;
            if(comment) {
                memcpy(pkey->add_s, comment, comment_len);
                pkey->add_s += comment_len;
            }

            _libssh2_htonu32(pkey->add_s, (uint32_t)name_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, name, name_len);
            pkey->add_s += name_len;
            _libssh2_htonu32(pkey->add_s, (uint32_t)blob_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, blob, blob_len);
            pkey->add_s += blob_len;
        }
        else {
            /* Version == 2 */

            _libssh2_htonu32(pkey->add_s, (uint32_t)name_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, name, name_len);
            pkey->add_s += name_len;
            _libssh2_htonu32(pkey->add_s, (uint32_t)blob_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, blob, blob_len);
            pkey->add_s += blob_len;
            *(pkey->add_s++) = overwrite ? 0x01 : 0;
            _libssh2_htonu32(pkey->add_s, (uint32_t)num_attrs);
            pkey->add_s += 4;
            for(i = 0; i < num_attrs; i++) {
                _libssh2_htonu32(pkey->add_s, (uint32_t)attrs[i].name_len);
                pkey->add_s += 4;
                memcpy(pkey->add_s, attrs[i].name, attrs[i].name_len);
                pkey->add_s += attrs[i].name_len;
                _libssh2_htonu32(pkey->add_s, (uint32_t)attrs[i].value_len);
                pkey->add_s += 4;
                memcpy(pkey->add_s, attrs[i].value, attrs[i].value_len);
                pkey->add_s += attrs[i].value_len;
                *(pkey->add_s++) = attrs[i].mandatory ? 0x01 : 0;
            }
        }

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"add\" packet: "
                       "type=%s blob_len=%ld num_attrs=%ld",
                       name, blob_len, num_attrs));

        pkey->add_state = libssh2_NB_state_created;
    }

    if(pkey->add_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, pkey->add_packet,
                                          (pkey->add_s - pkey->add_packet));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->add_s - pkey->add_packet) != nwritten) {
            LIBSSH2_FREE(session, pkey->add_packet);
            pkey->add_packet = NULL;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey add packet");
        }
        LIBSSH2_FREE(session, pkey->add_packet);
        pkey->add_packet = NULL;

        pkey->add_state = libssh2_NB_state_sent;
    }

    rc = publickey_response_success(pkey);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }

    pkey->add_state = libssh2_NB_state_idle;

    return rc;
}